

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesio.cpp
# Opt level: O3

VariablesArray * __thiscall
bal::VariableTextReader::read_variable_value
          (VariablesArray *__return_storage_ptr__,VariableTextReader *this)

{
  uint *__src;
  _func_int **pp_Var1;
  _func_int *p_Var2;
  ulong uVar3;
  TextReader *pTVar4;
  bool bVar5;
  bool bVar6;
  variableid_t element_size;
  variableid_t local_4c;
  Container<unsigned_int> local_48;
  
  p_Var2 = this->_vptr_VariableTextReader[-3];
  pTVar4 = (TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var2);
  TextReader::load_next_token(pTVar4);
  if ((*(long *)(&this->field_0x10 + (long)p_Var2) == 0) ||
     ((pTVar4->current_line_)._M_dataplus._M_p[pTVar4->current_token_pos_] != '{')) {
    bVar6 = false;
  }
  else {
    pp_Var1 = this->_vptr_VariableTextReader;
    p_Var2 = pp_Var1[-3];
    if (*(long *)(&this->field_0x10 + (long)p_Var2) != 0) {
      *(long *)(&this->field_0x8 + (long)p_Var2) = *(long *)(&this->field_0x8 + (long)p_Var2) + 1;
      *(undefined8 *)(&this->field_0x10 + (long)p_Var2) = 0;
      *(undefined4 *)(&this->field_0x40 + (long)p_Var2) = 0;
      p_Var2 = pp_Var1[-3];
    }
    uVar3 = *(ulong *)(&this->field_0x8 + (long)p_Var2);
    if (uVar3 < *(ulong *)(&this->field_0x20 + (long)p_Var2)) {
      bVar5 = *(long *)(&this->field_0x10 + (long)p_Var2) == 0;
      do {
        uVar3 = uVar3 + 1;
        if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var2) + -1 + uVar3) != ' ')
        goto LAB_00110746;
        *(ulong *)(&this->field_0x8 + (long)p_Var2) = uVar3;
        if (!bVar5) {
          *(undefined8 *)(&this->field_0x10 + (long)p_Var2) = 0;
          *(undefined4 *)(&this->field_0x40 + (long)p_Var2) = 0;
        }
        bVar5 = true;
        bVar6 = true;
      } while (uVar3 != *(ulong *)(&this->field_0x20 + (long)p_Var2));
    }
    else {
LAB_00110746:
      bVar6 = true;
    }
  }
  local_48.data_ = (uint *)0x0;
  local_48.size_ = 0;
  local_48.allocated_size_ = 0;
  local_4c = 0;
  read_variable_element_(this,&local_48,&local_4c);
  if (bVar6) {
    pp_Var1 = this->_vptr_VariableTextReader;
    p_Var2 = pp_Var1[-3];
    uVar3 = *(ulong *)(&this->field_0x8 + (long)p_Var2);
    if (uVar3 < *(ulong *)(&this->field_0x20 + (long)p_Var2)) {
      bVar6 = *(long *)(&this->field_0x10 + (long)p_Var2) == 0;
      do {
        uVar3 = uVar3 + 1;
        if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var2) + -1 + uVar3) != ' ') break;
        *(ulong *)(&this->field_0x8 + (long)p_Var2) = uVar3;
        if (!bVar6) {
          *(undefined8 *)(&this->field_0x10 + (long)p_Var2) = 0;
          *(undefined4 *)(&this->field_0x40 + (long)p_Var2) = 0;
        }
        bVar6 = true;
      } while (uVar3 != *(ulong *)(&this->field_0x20 + (long)p_Var2));
    }
    do {
      pTVar4 = (TextReader *)((long)&this->_vptr_VariableTextReader + (long)pp_Var1[-3]);
      TextReader::load_next_token(pTVar4);
      if ((pTVar4->current_token_len_ == 0) ||
         ((pTVar4->current_line_)._M_dataplus._M_p[pTVar4->current_token_pos_] != ','))
      goto LAB_0011090a;
      pp_Var1 = this->_vptr_VariableTextReader;
      p_Var2 = pp_Var1[-3];
      if (*(long *)(&this->field_0x10 + (long)p_Var2) != 0) {
        *(long *)(&this->field_0x8 + (long)p_Var2) = *(long *)(&this->field_0x8 + (long)p_Var2) + 1;
        *(undefined8 *)(&this->field_0x10 + (long)p_Var2) = 0;
        *(undefined4 *)(&this->field_0x40 + (long)p_Var2) = 0;
        p_Var2 = pp_Var1[-3];
      }
      uVar3 = *(ulong *)(&this->field_0x8 + (long)p_Var2);
      if (uVar3 < *(ulong *)(&this->field_0x20 + (long)p_Var2)) {
        bVar6 = *(long *)(&this->field_0x10 + (long)p_Var2) == 0;
        do {
          uVar3 = uVar3 + 1;
          if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var2) + -1 + uVar3) != ' ') break;
          *(ulong *)(&this->field_0x8 + (long)p_Var2) = uVar3;
          if (!bVar6) {
            *(undefined8 *)(&this->field_0x10 + (long)p_Var2) = 0;
            *(undefined4 *)(&this->field_0x40 + (long)p_Var2) = 0;
          }
          bVar6 = true;
        } while (uVar3 != *(ulong *)(&this->field_0x20 + (long)p_Var2));
      }
      read_variable_element_(this,&local_48,&local_4c);
      pp_Var1 = this->_vptr_VariableTextReader;
      p_Var2 = pp_Var1[-3];
      uVar3 = *(ulong *)(&this->field_0x8 + (long)p_Var2);
      if (uVar3 < *(ulong *)(&this->field_0x20 + (long)p_Var2)) {
        bVar6 = *(long *)(&this->field_0x10 + (long)p_Var2) == 0;
        do {
          uVar3 = uVar3 + 1;
          if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var2) + -1 + uVar3) != ' ') break;
          *(ulong *)(&this->field_0x8 + (long)p_Var2) = uVar3;
          if (!bVar6) {
            *(undefined8 *)(&this->field_0x10 + (long)p_Var2) = 0;
            *(undefined4 *)(&this->field_0x40 + (long)p_Var2) = 0;
          }
          bVar6 = true;
        } while (uVar3 != *(ulong *)(&this->field_0x20 + (long)p_Var2));
      }
    } while( true );
  }
  goto LAB_00110980;
LAB_0011090a:
  TextReader::read_symbol
            ((TextReader *)
             ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]),'}')
  ;
  p_Var2 = this->_vptr_VariableTextReader[-3];
  uVar3 = *(ulong *)(&this->field_0x8 + (long)p_Var2);
  if (uVar3 < *(ulong *)(&this->field_0x20 + (long)p_Var2)) {
    bVar6 = *(long *)(&this->field_0x10 + (long)p_Var2) == 0;
    do {
      uVar3 = uVar3 + 1;
      if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var2) + -1 + uVar3) != ' ') break;
      *(ulong *)(&this->field_0x8 + (long)p_Var2) = uVar3;
      if (!bVar6) {
        *(undefined8 *)(&this->field_0x10 + (long)p_Var2) = 0;
        *(undefined4 *)(&this->field_0x40 + (long)p_Var2) = 0;
      }
      bVar6 = true;
    } while (uVar3 != *(ulong *)(&this->field_0x20 + (long)p_Var2));
  }
LAB_00110980:
  read_variable_elements_sequence_(this,&local_48,local_48.size_);
  __src = local_48.data_;
  VariablesArray::VariablesArray(__return_storage_ptr__,local_48.size_ / local_4c,local_4c);
  uVar3 = (ulong)(__return_storage_ptr__->super_Container<unsigned_int>).size_;
  if (uVar3 != 0) {
    memmove((__return_storage_ptr__->super_Container<unsigned_int>).data_,__src,uVar3 << 2);
  }
  if ((local_48.allocated_size_ != 0) && (local_48.data_ != (uint *)0x0)) {
    free(local_48.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

VariablesArray VariableTextReader::read_variable_value() {
        bool is_value_bracket = false;
        if (is_symbol('{')) {
            skip_symbol();
            skip_space();
            is_value_bracket = true;
        };
        
        Container<literalid_t> value;

        // the first element
        variableid_t element_size = 0;
        read_variable_element_(value, element_size);
        
        if (is_value_bracket) {
            // read more elements
            skip_space();
            while (is_symbol(',')) {
                skip_symbol();
                skip_space();
                read_variable_element_(value, element_size);
                skip_space();
            };
            
            read_symbol('}');
            skip_space();
        };
        
        read_variable_elements_sequence_(value, value.size_);
        
        return VariablesArray(value.size_ / element_size, element_size, value.data_);
    }